

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btTriangleBuffer.cpp
# Opt level: O2

void __thiscall
btTriangleBuffer::processTriangle
          (btTriangleBuffer *this,btVector3 *triangle,int partId,int triangleIndex)

{
  btTriangle tri;
  btTriangle local_38;
  
  local_38.m_vertex0.m_floats._0_8_ = *(undefined8 *)triangle->m_floats;
  local_38.m_vertex0.m_floats._8_8_ = *(undefined8 *)(triangle->m_floats + 2);
  local_38.m_vertex1.m_floats._0_8_ = *(undefined8 *)triangle[1].m_floats;
  local_38.m_vertex1.m_floats._8_8_ = *(undefined8 *)(triangle[1].m_floats + 2);
  local_38.m_vertex2.m_floats._0_8_ = *(undefined8 *)triangle[2].m_floats;
  local_38.m_vertex2.m_floats._8_8_ = *(undefined8 *)(triangle[2].m_floats + 2);
  local_38.m_partId = partId;
  local_38.m_triangleIndex = triangleIndex;
  btAlignedObjectArray<btTriangle>::push_back(&this->m_triangleBuffer,&local_38);
  return;
}

Assistant:

void btTriangleBuffer::processTriangle(btVector3* triangle,int partId,int  triangleIndex)
{
		btTriangle	tri;
		tri.m_vertex0 = triangle[0];
		tri.m_vertex1 = triangle[1];
		tri.m_vertex2 = triangle[2];
		tri.m_partId = partId;
		tri.m_triangleIndex = triangleIndex;
			
		m_triangleBuffer.push_back(tri);
}